

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::OrientedDiscMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [32];
  byte bVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Scene *pSVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar56;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  float fVar68;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_2e4;
  Scene *local_2e0;
  Ray *local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  float local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  RayQueryContext *local_298;
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  float local_80 [4];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar25 = context->scene;
  uVar7 = Disc->sharedGeomID;
  pGVar8 = (pSVar25->geometries).items[uVar7].ptr;
  fVar39 = (pGVar8->time_range).lower;
  fVar39 = pGVar8->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar39) / ((pGVar8->time_range).upper - fVar39));
  auVar12 = vroundss_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),9);
  auVar12 = vminss_avx(auVar12,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar12 = vmaxss_avx(ZEXT816(0),auVar12);
  iVar17 = (int)auVar12._0_4_;
  uVar19 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar18 = (long)iVar17 * 0x38;
  lVar10 = *(long *)(lVar9 + lVar18);
  lVar20 = *(long *)(lVar9 + 0x10 + lVar18);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar28 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar23 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar23);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar19);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar21);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar24);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar26);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar28);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar22);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar29);
  p_Var11 = pGVar8[2].intersectionFilterN;
  lVar10 = *(long *)(p_Var11 + lVar18);
  lVar20 = *(long *)(p_Var11 + lVar18 + 0x10);
  auVar47._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar23);
  auVar47._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar19);
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar21);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar24);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar26);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar28);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar22);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar20 * uVar29);
  lVar20 = (long)(iVar17 + 1) * 0x38;
  lVar10 = *(long *)(lVar9 + lVar20);
  lVar9 = *(long *)(lVar9 + 0x10 + lVar20);
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar23);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar19);
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar21);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar24);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar26);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar28);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar22);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar29);
  lVar9 = *(long *)(p_Var11 + lVar20);
  lVar10 = *(long *)(p_Var11 + lVar20 + 0x10);
  auVar30._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar23 * lVar10);
  auVar30._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar19 * lVar10);
  fVar39 = fVar39 - auVar12._0_4_;
  auVar35 = vunpcklps_avx(auVar73,auVar44);
  local_200 = vunpckhps_avx(auVar73,auVar44);
  auVar44 = vunpcklps_avx(auVar33,auVar69);
  local_140 = vunpckhps_avx(auVar33,auVar69);
  auVar37 = vunpcklps_avx(auVar35,auVar44);
  auVar35 = vunpckhps_avx(auVar35,auVar44);
  auVar34 = vunpcklps_avx(auVar47,auVar62);
  auVar44 = vunpckhps_avx(auVar47,auVar62);
  auVar36 = vunpcklps_avx(auVar57,auVar66);
  auVar33 = vunpckhps_avx(auVar57,auVar66);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar26 * lVar10);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar28 * lVar10);
  auVar42 = vunpcklps_avx(auVar44,auVar33);
  auVar47 = vunpcklps_avx(auVar34,auVar36);
  auVar44 = vunpckhps_avx(auVar34,auVar36);
  auVar33 = vunpcklps_avx(auVar45,auVar70);
  local_160 = vunpckhps_avx(auVar45,auVar70);
  auVar34 = vunpcklps_avx(auVar40,auVar71);
  local_180 = vunpckhps_avx(auVar40,auVar71);
  auVar40 = vunpcklps_avx(auVar33,auVar34);
  auVar33 = vunpckhps_avx(auVar33,auVar34);
  auVar45 = vunpcklps_avx(auVar30,auVar67);
  auVar34 = vunpckhps_avx(auVar30,auVar67);
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar21 * lVar10);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar24 * lVar10);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar22);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar29 * lVar10);
  auVar30 = vunpcklps_avx(auVar41,auVar58);
  auVar36 = vunpckhps_avx(auVar41,auVar58);
  auVar41 = vunpcklps_avx(auVar34,auVar36);
  auVar36 = vunpcklps_avx(auVar45,auVar30);
  auVar34 = vunpckhps_avx(auVar45,auVar30);
  auVar12 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
  auVar13 = vshufps_avx(ZEXT416((uint)(1.0 - fVar39)),ZEXT416((uint)(1.0 - fVar39)),0);
  fVar56 = auVar12._0_4_;
  fVar59 = auVar12._4_4_;
  fVar60 = auVar12._8_4_;
  fVar61 = auVar12._12_4_;
  local_240._0_4_ = auVar37._0_4_;
  local_240._4_4_ = auVar37._4_4_;
  fStack_238 = auVar37._8_4_;
  fStack_234 = auVar37._12_4_;
  fStack_230 = auVar37._16_4_;
  fStack_22c = auVar37._20_4_;
  fStack_228 = auVar37._24_4_;
  fVar65 = auVar13._0_4_;
  fVar68 = auVar13._4_4_;
  fVar55 = auVar13._8_4_;
  fVar52 = auVar13._12_4_;
  local_240._4_4_ = fVar68 * (float)local_240._4_4_ + fVar59 * auVar40._4_4_;
  local_240._0_4_ = fVar65 * (float)local_240._0_4_ + fVar56 * auVar40._0_4_;
  fStack_238 = fVar55 * fStack_238 + fVar60 * auVar40._8_4_;
  fStack_234 = fVar52 * fStack_234 + fVar61 * auVar40._12_4_;
  fStack_230 = fVar65 * fStack_230 + fVar56 * auVar40._16_4_;
  fStack_22c = fVar68 * fStack_22c + fVar59 * auVar40._20_4_;
  fStack_228 = fVar55 * fStack_228 + fVar60 * auVar40._24_4_;
  fStack_224 = auVar40._28_4_ + 0.0;
  auVar37 = vunpcklps_avx(local_200,local_140);
  local_220._0_4_ = fVar65 * auVar35._0_4_ + fVar56 * auVar33._0_4_;
  local_220._4_4_ = fVar68 * auVar35._4_4_ + fVar59 * auVar33._4_4_;
  local_220._8_4_ = fVar55 * auVar35._8_4_ + fVar60 * auVar33._8_4_;
  local_220._12_4_ = fVar52 * auVar35._12_4_ + fVar61 * auVar33._12_4_;
  local_220._16_4_ = fVar65 * auVar35._16_4_ + fVar56 * auVar33._16_4_;
  local_220._20_4_ = fVar68 * auVar35._20_4_ + fVar59 * auVar33._20_4_;
  local_220._24_4_ = fVar55 * auVar35._24_4_ + fVar60 * auVar33._24_4_;
  local_220._28_4_ = auVar35._28_4_ + auVar40._28_4_;
  auVar35 = vunpcklps_avx(local_160,local_180);
  auVar63._0_4_ = fVar65 * auVar37._0_4_ + fVar56 * auVar35._0_4_;
  auVar63._4_4_ = fVar68 * auVar37._4_4_ + fVar59 * auVar35._4_4_;
  auVar63._8_4_ = fVar55 * auVar37._8_4_ + fVar60 * auVar35._8_4_;
  auVar63._12_4_ = fVar52 * auVar37._12_4_ + fVar61 * auVar35._12_4_;
  auVar63._16_4_ = fVar65 * auVar37._16_4_ + fVar56 * auVar35._16_4_;
  auVar63._20_4_ = fVar68 * auVar37._20_4_ + fVar59 * auVar35._20_4_;
  auVar63._24_4_ = fVar55 * auVar37._24_4_ + fVar60 * auVar35._24_4_;
  auVar63._28_4_ = auVar37._28_4_ + auVar35._28_4_;
  fVar14 = auVar33._28_4_;
  local_1a0 = fVar65 * auVar47._0_4_ + fVar56 * auVar36._0_4_;
  fStack_19c = fVar68 * auVar47._4_4_ + fVar59 * auVar36._4_4_;
  fStack_198 = fVar55 * auVar47._8_4_ + fVar60 * auVar36._8_4_;
  fStack_194 = fVar52 * auVar47._12_4_ + fVar61 * auVar36._12_4_;
  fStack_190 = fVar65 * auVar47._16_4_ + fVar56 * auVar36._16_4_;
  fStack_18c = fVar68 * auVar47._20_4_ + fVar59 * auVar36._20_4_;
  fStack_188 = fVar55 * auVar47._24_4_ + fVar60 * auVar36._24_4_;
  fStack_184 = fVar14 + auVar37._28_4_;
  local_1c0 = fVar65 * auVar44._0_4_ + fVar56 * auVar34._0_4_;
  fStack_1bc = fVar68 * auVar44._4_4_ + fVar59 * auVar34._4_4_;
  fStack_1b8 = fVar55 * auVar44._8_4_ + fVar60 * auVar34._8_4_;
  fStack_1b4 = fVar52 * auVar44._12_4_ + fVar61 * auVar34._12_4_;
  fStack_1b0 = fVar65 * auVar44._16_4_ + fVar56 * auVar34._16_4_;
  fStack_1ac = fVar68 * auVar44._20_4_ + fVar59 * auVar34._20_4_;
  fStack_1a8 = fVar55 * auVar44._24_4_ + fVar60 * auVar34._24_4_;
  fStack_1a4 = fVar14 + auVar36._28_4_;
  local_260._0_4_ = auVar42._0_4_;
  local_260._4_4_ = auVar42._4_4_;
  fStack_258 = auVar42._8_4_;
  fStack_254 = auVar42._12_4_;
  fStack_250 = auVar42._16_4_;
  fStack_24c = auVar42._20_4_;
  fStack_248 = auVar42._24_4_;
  local_1d0 = vshufps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0);
  local_1e0 = local_1d0;
  fVar39 = (ray->dir).field_0.m128[1];
  local_80[0] = fVar65 * (float)local_260._0_4_ + fVar56 * auVar41._0_4_;
  local_80[1] = fVar68 * (float)local_260._4_4_ + fVar59 * auVar41._4_4_;
  local_80[2] = fVar55 * fStack_258 + fVar60 * auVar41._8_4_;
  local_80[3] = fVar52 * fStack_254 + fVar61 * auVar41._12_4_;
  fStack_70 = fVar65 * fStack_250 + fVar56 * auVar41._16_4_;
  fStack_6c = fVar68 * fStack_24c + fVar59 * auVar41._20_4_;
  fStack_68 = fVar55 * fStack_248 + fVar60 * auVar41._24_4_;
  fVar1 = (ray->dir).field_0.m128[2];
  fVar2 = (ray->dir).field_0.m128[0];
  auVar34._0_4_ = fVar2 * local_1a0 + fVar39 * local_1c0 + fVar1 * local_80[0];
  auVar34._4_4_ = fVar2 * fStack_19c + fVar39 * fStack_1bc + fVar1 * local_80[1];
  auVar34._8_4_ = fVar2 * fStack_198 + fVar39 * fStack_1b8 + fVar1 * local_80[2];
  auVar34._12_4_ = fVar2 * fStack_194 + fVar39 * fStack_1b4 + fVar1 * local_80[3];
  auVar34._16_4_ = fVar2 * fStack_190 + fVar39 * fStack_1b0 + fVar1 * fStack_70;
  auVar34._20_4_ = fVar2 * fStack_18c + fVar39 * fStack_1ac + fVar1 * fStack_6c;
  auVar34._24_4_ = fVar2 * fStack_188 + fVar39 * fStack_1a8 + fVar1 * fStack_68;
  auVar34._28_4_ = fVar14 + auVar41._28_4_ + 0.0;
  auVar12 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar35._16_16_ = auVar12;
  auVar35._0_16_ = auVar12;
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar44 = vcmpps_avx(_DAT_02020f40,auVar35,1);
  auVar33 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,0);
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = &DAT_3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  auVar36._16_4_ = 0x3f800000;
  auVar36._20_4_ = 0x3f800000;
  auVar36._24_4_ = 0x3f800000;
  auVar36._28_4_ = 0x3f800000;
  auVar35 = vblendvps_avx(auVar34,auVar36,auVar33);
  fVar3 = (ray->org).field_0.m128[1];
  auVar37._4_4_ = fVar3;
  auVar37._0_4_ = fVar3;
  auVar37._8_4_ = fVar3;
  auVar37._12_4_ = fVar3;
  auVar37._16_4_ = fVar3;
  auVar37._20_4_ = fVar3;
  auVar37._24_4_ = fVar3;
  auVar37._28_4_ = fVar3;
  auVar44 = vandnps_avx(auVar33,auVar44);
  fVar4 = (ray->org).field_0.m128[2];
  auVar72._4_4_ = fVar4;
  auVar72._0_4_ = fVar4;
  auVar72._8_4_ = fVar4;
  auVar72._12_4_ = fVar4;
  auVar72._16_4_ = fVar4;
  auVar72._20_4_ = fVar4;
  auVar72._24_4_ = fVar4;
  auVar72._28_4_ = fVar4;
  auVar33 = vsubps_avx(auVar63,auVar72);
  auVar34 = vsubps_avx(local_220,auVar37);
  fVar5 = (ray->org).field_0.m128[0];
  auVar42._4_4_ = fVar5;
  auVar42._0_4_ = fVar5;
  auVar42._8_4_ = fVar5;
  auVar42._12_4_ = fVar5;
  auVar42._16_4_ = fVar5;
  auVar42._20_4_ = fVar5;
  auVar42._24_4_ = fVar5;
  auVar42._28_4_ = fVar5;
  auVar36 = vsubps_avx(_local_240,auVar42);
  auVar48._0_4_ =
       auVar36._0_4_ * local_1a0 + local_1c0 * auVar34._0_4_ + local_80[0] * auVar33._0_4_;
  auVar48._4_4_ =
       auVar36._4_4_ * fStack_19c + fStack_1bc * auVar34._4_4_ + local_80[1] * auVar33._4_4_;
  auVar48._8_4_ =
       auVar36._8_4_ * fStack_198 + fStack_1b8 * auVar34._8_4_ + local_80[2] * auVar33._8_4_;
  auVar48._12_4_ =
       auVar36._12_4_ * fStack_194 + fStack_1b4 * auVar34._12_4_ + local_80[3] * auVar33._12_4_;
  auVar48._16_4_ =
       auVar36._16_4_ * fStack_190 + fStack_1b0 * auVar34._16_4_ + fStack_70 * auVar33._16_4_;
  auVar48._20_4_ =
       auVar36._20_4_ * fStack_18c + fStack_1ac * auVar34._20_4_ + fStack_6c * auVar33._20_4_;
  auVar48._24_4_ =
       auVar36._24_4_ * fStack_188 + fStack_1a8 * auVar34._24_4_ + fStack_68 * auVar33._24_4_;
  auVar48._28_4_ = auVar36._28_4_ + auVar34._28_4_ + auVar33._28_4_;
  local_e0 = vdivps_avx(auVar48,auVar35);
  uVar27 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar49._4_4_ = uVar27;
  auVar49._0_4_ = uVar27;
  auVar49._8_4_ = uVar27;
  auVar49._12_4_ = uVar27;
  auVar49._16_4_ = uVar27;
  auVar49._20_4_ = uVar27;
  auVar49._24_4_ = uVar27;
  auVar49._28_4_ = uVar27;
  fVar6 = ray->tfar;
  auVar64._4_4_ = fVar6;
  auVar64._0_4_ = fVar6;
  auVar64._8_4_ = fVar6;
  auVar64._12_4_ = fVar6;
  auVar64._16_4_ = fVar6;
  auVar64._20_4_ = fVar6;
  auVar64._24_4_ = fVar6;
  auVar64._28_4_ = fVar6;
  auVar35 = vcmpps_avx(auVar49,local_e0,2);
  auVar33 = vcmpps_avx(local_e0,auVar64,2);
  auVar35 = vandps_avx(auVar33,auVar35);
  auVar33 = auVar44 & auVar35;
  if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0x7f,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar33 >> 0xbf,0) != '\0') ||
      (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0') {
    auVar35 = vandps_avx(auVar44,auVar35);
    auVar44 = vunpckhps_avx(local_200,local_140);
    auVar33 = vunpckhps_avx(local_160,local_180);
    fVar46 = fVar65 * auVar44._0_4_ + auVar33._0_4_ * fVar56;
    fVar50 = fVar68 * auVar44._4_4_ + auVar33._4_4_ * fVar59;
    fVar51 = fVar55 * auVar44._8_4_ + auVar33._8_4_ * fVar60;
    fVar52 = fVar52 * auVar44._12_4_ + auVar33._12_4_ * fVar61;
    fVar53 = fVar65 * auVar44._16_4_ + auVar33._16_4_ * fVar56;
    fVar54 = fVar68 * auVar44._20_4_ + auVar33._20_4_ * fVar59;
    fVar55 = fVar55 * auVar44._24_4_ + auVar33._24_4_ * fVar60;
    fVar6 = local_e0._0_4_;
    fVar56 = local_e0._4_4_;
    fVar59 = local_e0._8_4_;
    fVar60 = local_e0._12_4_;
    fVar61 = local_e0._16_4_;
    fVar65 = local_e0._20_4_;
    fVar68 = local_e0._24_4_;
    auVar31._0_4_ = fVar5 + fVar2 * fVar6;
    auVar31._4_4_ = fVar5 + fVar2 * fVar56;
    auVar31._8_4_ = fVar5 + fVar2 * fVar59;
    auVar31._12_4_ = fVar5 + fVar2 * fVar60;
    auVar31._16_4_ = fVar5 + fVar2 * fVar61;
    auVar31._20_4_ = fVar5 + fVar2 * fVar65;
    auVar31._24_4_ = fVar5 + fVar2 * fVar68;
    auVar31._28_4_ = fVar5 + fVar2;
    auVar38._0_4_ = fVar3 + fVar39 * fVar6;
    auVar38._4_4_ = fVar3 + fVar39 * fVar56;
    auVar38._8_4_ = fVar3 + fVar39 * fVar59;
    auVar38._12_4_ = fVar3 + fVar39 * fVar60;
    auVar38._16_4_ = fVar3 + fVar39 * fVar61;
    auVar38._20_4_ = fVar3 + fVar39 * fVar65;
    auVar38._24_4_ = fVar3 + fVar39 * fVar68;
    auVar38._28_4_ = fVar3 + fVar5;
    auVar43._0_4_ = fVar4 + fVar1 * fVar6;
    auVar43._4_4_ = fVar4 + fVar1 * fVar56;
    auVar43._8_4_ = fVar4 + fVar1 * fVar59;
    auVar43._12_4_ = fVar4 + fVar1 * fVar60;
    auVar43._16_4_ = fVar4 + fVar1 * fVar61;
    auVar43._20_4_ = fVar4 + fVar1 * fVar65;
    auVar43._24_4_ = fVar4 + fVar1 * fVar68;
    auVar43._28_4_ = fVar4 + fVar5;
    auVar44 = vsubps_avx(auVar31,_local_240);
    auVar33 = vsubps_avx(auVar38,local_220);
    auVar34 = vsubps_avx(auVar43,auVar63);
    fVar39 = auVar33._28_4_ + auVar34._28_4_;
    auVar32._0_4_ =
         auVar44._0_4_ * auVar44._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar32._4_4_ =
         auVar44._4_4_ * auVar44._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar32._8_4_ =
         auVar44._8_4_ * auVar44._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar32._12_4_ =
         auVar44._12_4_ * auVar44._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar32._16_4_ =
         auVar44._16_4_ * auVar44._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar34._16_4_ * auVar34._16_4_;
    auVar32._20_4_ =
         auVar44._20_4_ * auVar44._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar34._20_4_ * auVar34._20_4_;
    auVar32._24_4_ =
         auVar44._24_4_ * auVar44._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar34._24_4_ * auVar34._24_4_;
    auVar32._28_4_ = auVar44._28_4_ + fVar39;
    auVar15._4_4_ = fVar50 * fVar50;
    auVar15._0_4_ = fVar46 * fVar46;
    auVar15._8_4_ = fVar51 * fVar51;
    auVar15._12_4_ = fVar52 * fVar52;
    auVar15._16_4_ = fVar53 * fVar53;
    auVar15._20_4_ = fVar54 * fVar54;
    auVar15._24_4_ = fVar55 * fVar55;
    auVar15._28_4_ = fVar39;
    auVar44 = vcmpps_avx(auVar32,auVar15,1);
    auVar33 = auVar35 & auVar44;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar35 = vandps_avx(auVar35,auVar44);
      local_100 = ZEXT432(0) << 0x20;
      local_120 = ZEXT432(0) << 0x20;
      local_c0 = CONCAT44(fStack_19c,local_1a0);
      uStack_b8 = CONCAT44(fStack_194,fStack_198);
      uStack_b0 = CONCAT44(fStack_18c,fStack_190);
      uStack_a8 = CONCAT44(fStack_184,fStack_188);
      local_a0 = CONCAT44(fStack_1bc,local_1c0);
      uStack_98 = CONCAT44(fStack_1b4,fStack_1b8);
      uStack_90 = CONCAT44(fStack_1ac,fStack_1b0);
      uStack_88 = CONCAT44(fStack_1a4,fStack_1a8);
      fStack_64 = fVar14 + auVar41._28_4_;
      uVar27 = vmovmskps_avx(auVar35);
      uVar29 = CONCAT44((int)(uVar28 * lVar10 >> 0x20),uVar27);
      local_2e0 = pSVar25;
      local_2d8 = ray;
      local_298 = context;
      _local_260 = auVar63;
      do {
        local_290.hit = (RTCHitN *)&local_2d0;
        local_290.valid = &local_2e4;
        uVar19 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_2b8 = *(uint *)(local_1e0 + uVar19 * 4);
        pGVar8 = (pSVar25->geometries).items[local_2b8].ptr;
        if ((pGVar8->mask & ray->mask) == 0) {
LAB_011c12fc:
          uVar29 = uVar29 ^ 1L << (uVar19 & 0x3f);
          bVar16 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_2c4 = *(undefined4 *)(local_120 + uVar19 * 4);
            local_2c0 = *(undefined4 *)(local_100 + uVar19 * 4);
            local_2bc = (Disc->primIDs).field_0.i[uVar19];
            local_2d0 = *(undefined4 *)((long)&local_c0 + uVar19 * 4);
            local_2cc = *(undefined4 *)((long)&local_a0 + uVar19 * 4);
            local_2c8 = local_80[uVar19];
            local_2b4 = context->user->instID[0];
            local_2b0 = context->user->instPrimID[0];
            local_220._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_e0 + uVar19 * 4);
            local_2e4 = -1;
            local_290.geometryUserPtr = pGVar8->userPtr;
            local_290.context = context->user;
            local_290.N = 1;
            local_290.ray = (RTCRayN *)ray;
            if ((pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar8->occlusionFilterN)(&local_290), ray = local_2d8, pSVar25 = local_2e0,
               *local_290.valid == 0)) {
LAB_011c1453:
              ray->tfar = (float)local_220._0_4_;
              goto LAB_011c12fc;
            }
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_290);
                ray = local_2d8;
                pSVar25 = local_2e0;
              }
              if (*local_290.valid == 0) goto LAB_011c1453;
            }
          }
          bVar16 = 0;
        }
        if ((bVar16 == 0) || (uVar29 == 0)) {
          return (bool)(bVar16 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }